

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iRpn.cpp
# Opt level: O2

void __thiscall Imaginer::Utils::iRpn::Parser(iRpn *this)

{
  int iVar1;
  RPNnode *pRVar2;
  undefined1 uVar3;
  bool bVar4;
  ostream *poVar5;
  ulong uVar6;
  double dVar7;
  long lVar8;
  anon_union_8_2_93b31755_for__node *paVar9;
  char *pcVar10;
  long lVar11;
  long lVar12;
  double dVar13;
  iStack<Imaginer::Utils::iRpn::RPNnode> result;
  RPNnode curnode;
  iStack<Imaginer::Utils::iRpn::RPNnode> local_50;
  anon_union_8_2_93b31755_for__node local_40;
  bool local_38;
  
  local_40._0_4_ = 0x400;
  iStack<Imaginer::Utils::iRpn::RPNnode>::iStack(&local_50,(int *)&local_40._sign);
  iVar1 = this->_operands->_top;
  local_38 = false;
  local_40._value = 0.0;
  lVar12 = 0;
  lVar11 = 0;
  do {
    if (iVar1 < lVar11) {
LAB_00106a1b:
      poVar5 = operator<<((ostream *)&std::cout,&local_50);
      std::endl<char,std::char_traits<char>>(poVar5);
      iStack<Imaginer::Utils::iRpn::RPNnode>::~iStack(&local_50);
      return;
    }
    pRVar2 = this->_operands->_data;
    if ((anon_union_8_2_93b31755_for__node *)((long)&pRVar2->_node + lVar12) != &local_40) {
      local_40 = *(anon_union_8_2_93b31755_for__node *)((long)&pRVar2->_node + lVar12);
      local_38 = (&pRVar2->_is)[lVar12];
    }
    if ((local_38 & 1U) != 0) {
      lVar8 = (long)local_50._top;
      local_50._top = (int)(lVar8 + 1);
      paVar9 = &local_50._data[lVar8 + 1]._node;
      if (paVar9 != &local_40) {
        *paVar9 = local_40;
        bVar4 = local_38;
        goto LAB_001067fa;
      }
      goto LAB_00106973;
    }
    uVar3 = local_40._sign;
    lVar8 = (long)local_40._sign;
    if (((int)local_40._sign - 0x58U & 0xde) == 0) {
      lVar8 = (long)local_50._top;
      local_50._top = (int)(lVar8 + 1);
      paVar9 = &local_50._data[lVar8 + 1]._node;
      if (paVar9 != &local_40) {
        *paVar9 = local_40;
        paVar9[1]._sign = local_38;
      }
      poVar5 = std::operator<<((ostream *)&std::cout,"unknowns nunber ");
      poVar5 = operator<<(poVar5,(RPNnode *)&local_40);
LAB_0010696b:
      std::endl<char,std::char_traits<char>>(poVar5);
      goto LAB_00106973;
    }
    if (local_40._sign < '\0') {
      if (0x94 < (byte)local_40._sign) {
        poVar5 = std::operator<<((ostream *)&std::cout,"no sunch Function: ");
        std::endl<char,std::char_traits<char>>(poVar5);
        goto LAB_00106a1b;
      }
      poVar5 = std::operator<<((ostream *)&std::cout,"Function: ");
      poVar5 = std::operator<<(poVar5,(string *)(lVar8 * 0x20 + 0x10c560));
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    uVar6 = (ulong)(uint)local_50._top;
    if (local_50._top < 1) goto LAB_00106973;
    pcVar10 = "L cannot calculate";
    if (local_50._data[uVar6]._is == false) {
switchD_001068cf_caseD_2c:
      poVar5 = std::operator<<((ostream *)&std::cout,pcVar10);
      goto LAB_0010696b;
    }
    bVar4 = local_50._data[uVar6 - 1]._is;
    pcVar10 = "R cannot calculate";
    if (bVar4 == false) goto switchD_001068cf_caseD_2c;
    dVar7 = local_50._data[uVar6]._node._value;
    dVar13 = local_50._data[uVar6 - 1]._node._value;
    pcVar10 = "invalid operator";
    switch(uVar3) {
    case 0x2a:
      dVar13 = dVar7 * dVar13;
      break;
    case 0x2b:
      lVar8 = uVar6 + 1;
      local_50._top = (int)lVar8;
      paVar9 = &local_50._data[lVar8]._node;
      local_50._data[lVar8]._node =
           (anon_union_8_2_93b31755_for__node)(dVar7 + dVar13 & 0xffffffffffffff00);
      goto LAB_001069f9;
    case 0x2c:
    case 0x2e:
      goto switchD_001068cf_caseD_2c;
    case 0x2d:
      dVar13 = dVar13 - dVar7;
      break;
    case 0x2f:
      dVar13 = dVar13 / dVar7;
      break;
    default:
      if (uVar3 == 0x5e) {
        dVar7 = pow(dVar13,dVar7);
      }
      else {
        pcVar10 = "invalid operator";
        if (uVar3 != 0x5f) goto switchD_001068cf_caseD_2c;
        lVar8 = uVar6 + 1;
        local_50._top = (int)lVar8;
        local_50._data[lVar8]._node._value = dVar13;
        local_50._data[lVar8]._is = bVar4;
        dVar7 = -dVar7;
      }
      lVar8 = (long)local_50._top + 1;
      local_50._top = (int)lVar8;
      paVar9 = &local_50._data[lVar8]._node;
      local_50._data[lVar8]._node = (anon_union_8_2_93b31755_for__node)(dVar7 & 0xffffffffffffff00);
      goto LAB_001069f9;
    }
    local_50._top = local_50._top + 1;
    paVar9 = &local_50._data[uVar6 + 1]._node;
    *paVar9 = (anon_union_8_2_93b31755_for__node)(dVar13 & 0xffffffffffffff00);
LAB_001069f9:
    bVar4 = true;
LAB_001067fa:
    paVar9[1]._sign = bVar4;
LAB_00106973:
    lVar12 = lVar12 + 0x10;
    lVar11 = lVar11 + 1;
  } while( true );
}

Assistant:

void iRpn::Parser()
{
    //genRpn();
    //_operands->reverse();
    iStack<RPNnode> result;
    int size = _operands->size();
    RPNnode curnode;
    char op = '\0';
    RPNnode  loperand;
    RPNnode  roperand;
    for(int i = 0;i <= size;++i)
    {
        curnode = (*_operands)[i];
        //std::cout << curnode << "\n";
        if(!curnode)//opearator
        {
            if(isVariable(curnode))
            {
                result.push(curnode);
                std::cout << "unknowns nunber " << curnode << std::endl;
            }
            else
            {
                op = curnode;
                if(op < 0)
                {
                    if(isFun(op))
                        std::cout << "Function: " << _sysfunS[op+128] << std::endl;
                    else
                    {
                        std::cout << "no sunch Function: " << std::endl;
                        break;
                    }
                }
                if(result.empty() || result.size() < 1)
                {
                    continue;
                }
                loperand = result[-1];
                roperand = result[-2];
                if(!loperand)
                {
                    std::cout << "L cannot calculate" << std::endl;
                    continue;
                }
                if(!roperand)
                {
                    std::cout << "R cannot calculate" << std::endl;
                    continue;
                }
                switch (op)
                {
                case '_':
                    result.push(roperand);
                    result.push(-loperand);
                    break;
                case '+':
                    result.push(roperand+loperand);
                    break;
                case '-':
                    result.push(roperand-loperand);
                    break;
                case '*':
                    result.push(roperand*loperand);
                    break;
                case '/':
                    result.push(roperand/loperand);
                    break;
                case '^':
                    result.push(pow(roperand,loperand));
                    break;
                default:
                    std::cout << "invalid operator" << std::endl;
                    break;
                }
            }
        }
        else//operand
        {
            result.push(curnode);
            //std::cout << curnode << "\n";
        }
    }
    std::cout << result << std::endl;
}